

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darMan.c
# Opt level: O1

Dar_Man_t * Dar_ManStart(Aig_Man_t *pAig,Dar_RwrPar_t *pPars)

{
  Dar_Man_t *__s;
  Vec_Ptr_t *pVVar1;
  void **ppvVar2;
  Aig_MmFixed_t *pAVar3;
  
  Aig_ManCleanData(pAig);
  __s = (Dar_Man_t *)malloc(0xb08);
  memset(__s,0,0xb08);
  __s->pPars = pPars;
  __s->pAig = pAig;
  pVVar1 = (Vec_Ptr_t *)malloc(0x10);
  pVVar1->nCap = 1000;
  pVVar1->nSize = 0;
  ppvVar2 = (void **)malloc(8000);
  pVVar1->pArray = ppvVar2;
  __s->vCutNodes = pVVar1;
  pAVar3 = Aig_MmFixedStart(pPars->nCutsMax * 0x18,0x400);
  __s->pMemCuts = pAVar3;
  pVVar1 = (Vec_Ptr_t *)malloc(0x10);
  pVVar1->nCap = 8;
  pVVar1->nSize = 0;
  ppvVar2 = (void **)malloc(0x40);
  pVVar1->pArray = ppvVar2;
  __s->vLeavesBest = pVVar1;
  return __s;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Starts the rewriting manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Dar_Man_t * Dar_ManStart( Aig_Man_t * pAig, Dar_RwrPar_t * pPars )
{
    Dar_Man_t * p;
    Aig_ManCleanData( pAig );
    p = ABC_ALLOC( Dar_Man_t, 1 );
    memset( p, 0, sizeof(Dar_Man_t) );
    p->pPars = pPars;
    p->pAig  = pAig;
    p->vCutNodes = Vec_PtrAlloc( 1000 );
    p->pMemCuts = Aig_MmFixedStart( p->pPars->nCutsMax * sizeof(Dar_Cut_t), 1024 );
    p->vLeavesBest = Vec_PtrAlloc( 4 );
    return p;
}